

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)31,(moira::Mode)10,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)10,_1> dst;
  Ea<(moira::Mode)10,_1> local_3c;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  Op<(moira::Mode)10,1>(&local_3c,this,op & 7,addr);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar3 = 'b';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar3;
      cVar3 = "btst"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar1);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(Int)(int)(char)uVar4);
  }
  else {
    cVar3 = 'b';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar3;
      cVar3 = "btst"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar1);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(UInt)(uVar4 & 0xff));
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<S>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu<S>(src) << Sep{} << dst;
    }
}